

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

tinygltf * __thiscall tinygltf::GetBaseDir(tinygltf *this,string *filepath)

{
  string *psVar1;
  long lVar2;
  allocator local_19;
  string *local_18;
  string *filepath_local;
  
  local_18 = filepath;
  filepath_local = (string *)this;
  lVar2 = std::__cxx11::string::find_last_of((char *)filepath,0x1b662d);
  psVar1 = local_18;
  if (lVar2 == -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"",&local_19);
    std::allocator<char>::~allocator((allocator<char> *)&local_19);
  }
  else {
    std::__cxx11::string::find_last_of((char *)local_18,0x1b662d);
    std::__cxx11::string::substr((ulong)this,(ulong)psVar1);
  }
  return this;
}

Assistant:

static std::string GetBaseDir(const std::string &filepath) {
  if (filepath.find_last_of("/\\") != std::string::npos)
    return filepath.substr(0, filepath.find_last_of("/\\") + 1);
  return "";
}